

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectest-interp.cc
# Opt level: O0

Result __thiscall
spectest::JSONParser::ParseLaneConstValue
          (JSONParser *this,Type lane_type,int lane,ExpectedValue *out_value,string_view value_str,
          AllowExpected allow_expected)

{
  string_view value_str_00;
  string_view value_str_01;
  string_view value_str_02;
  string_view value_str_03;
  string_view value_str_04;
  string_view value_str_05;
  bool bVar1;
  Enum EVar2;
  undefined8 uVar3;
  size_t sVar4;
  string local_120;
  size_t local_100;
  size_t local_f8;
  Enum local_ec;
  uint64_t local_e8;
  uint64_t value_bits_1;
  size_t sStack_d8;
  ExpectedNan nan_1;
  size_t local_d0;
  Enum local_c4;
  uint32_t local_c0;
  ExpectedNan local_bc;
  uint32_t value_bits;
  ExpectedNan nan;
  size_t local_b0;
  Enum local_a4;
  uint64_t local_a0;
  uint64_t value_3;
  size_t local_90;
  Enum local_88;
  uint32_t local_84;
  size_t sStack_80;
  uint32_t value_2;
  size_t local_78;
  Enum local_70;
  uint16_t local_6c [2];
  size_t sStack_68;
  uint32_t value_1;
  size_t local_60;
  Enum local_58;
  uint8_t local_54 [4];
  undefined1 auStack_50 [4];
  uint32_t value;
  v128 v;
  ExpectedValue *out_value_local;
  int lane_local;
  JSONParser *this_local;
  string_view value_str_local;
  Type lane_type_local;
  
  value_str_local._M_len = (size_t)value_str._M_str;
  sVar4 = value_str._M_len;
  v.v._8_8_ = out_value;
  unique0x100004f1 = lane_type;
  _auStack_50 = wabt::interp::Value::Get<v128>(&(out_value->value).value);
  EVar2 = wabt::Type::operator_cast_to_Enum((Type *)((long)&value_str_local._M_str + 4));
  switch(EVar2) {
  case I16:
    local_78 = value_str_local._M_len;
    value_str_04._M_str = (char *)value_str_local._M_len;
    value_str_04._M_len = sVar4;
    sStack_80 = sVar4;
    local_70 = (Enum)ParseI32Value(this,(uint32_t *)local_6c,value_str_04);
    bVar1 = wabt::Failed((Result)local_70);
    if (bVar1) {
      wabt::Result::Result((Result *)&lane_type_local,Error);
      return (Result)lane_type_local.enum_;
    }
    v128::set_u16((v128 *)auStack_50,lane,local_6c[0]);
    break;
  case I8:
    local_60 = value_str_local._M_len;
    value_str_05._M_str = (char *)value_str_local._M_len;
    value_str_05._M_len = sVar4;
    sStack_68 = sVar4;
    local_58 = (Enum)ParseI32Value(this,(uint32_t *)local_54,value_str_05);
    bVar1 = wabt::Failed((Result)local_58);
    if (bVar1) {
      wabt::Result::Result((Result *)&lane_type_local,Error);
      return (Result)lane_type_local.enum_;
    }
    v128::set_u8((v128 *)auStack_50,lane,local_54[0]);
    break;
  default:
    wabt::Type::GetName_abi_cxx11_(&local_120,(Type *)((long)&value_str_local._M_str + 4));
    uVar3 = std::__cxx11::string::c_str();
    PrintError(this,"unknown concrete type: \"%s\"",uVar3);
    std::__cxx11::string::~string((string *)&local_120);
    wabt::Result::Result((Result *)&lane_type_local,Error);
    return (Result)lane_type_local.enum_;
  case F64:
    local_f8 = value_str_local._M_len;
    value_str_00._M_str = (char *)value_str_local._M_len;
    value_str_00._M_len = sVar4;
    local_100 = sVar4;
    local_ec = (Enum)ParseF64Value(this,&local_e8,(ExpectedNan *)((long)&value_bits_1 + 4),
                                   value_str_00,allow_expected);
    bVar1 = wabt::Failed((Result)local_ec);
    if (bVar1) {
      wabt::Result::Result((Result *)&lane_type_local,Error);
      return (Result)lane_type_local.enum_;
    }
    v128::set_f64_bits((v128 *)auStack_50,lane,local_e8);
    if (1 < lane) {
      __assert_fail("lane < 2",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/tools/spectest-interp.cc"
                    ,0x317,
                    "wabt::Result spectest::JSONParser::ParseLaneConstValue(Type, int, ExpectedValue *, std::string_view, AllowExpected)"
                   );
    }
    *(undefined4 *)(v.v._8_8_ + 0x20 + (long)lane * 4) = value_bits_1._4_4_;
    break;
  case F32:
    local_d0 = value_str_local._M_len;
    value_str_01._M_str = (char *)value_str_local._M_len;
    value_str_01._M_len = sVar4;
    sStack_d8 = sVar4;
    local_c4 = (Enum)ParseF32Value(this,&local_c0,&local_bc,value_str_01,allow_expected);
    bVar1 = wabt::Failed((Result)local_c4);
    if (bVar1) {
      wabt::Result::Result((Result *)&lane_type_local,Error);
      return (Result)lane_type_local.enum_;
    }
    v128::set_f32_bits((v128 *)auStack_50,lane,local_c0);
    if (3 < lane) {
      __assert_fail("lane < 4",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/tools/spectest-interp.cc"
                    ,0x30d,
                    "wabt::Result spectest::JSONParser::ParseLaneConstValue(Type, int, ExpectedValue *, std::string_view, AllowExpected)"
                   );
    }
    *(ExpectedNan *)(v.v._8_8_ + 0x20 + (long)lane * 4) = local_bc;
    break;
  case I64:
    local_b0 = value_str_local._M_len;
    value_str_02._M_str = (char *)value_str_local._M_len;
    value_str_02._M_len = sVar4;
    _value_bits = sVar4;
    local_a4 = (Enum)ParseI64Value(this,&local_a0,value_str_02);
    bVar1 = wabt::Failed((Result)local_a4);
    if (bVar1) {
      wabt::Result::Result((Result *)&lane_type_local,Error);
      return (Result)lane_type_local.enum_;
    }
    v128::set_u64((v128 *)auStack_50,lane,local_a0);
    break;
  case I32:
    local_90 = value_str_local._M_len;
    value_str_03._M_str = (char *)value_str_local._M_len;
    value_str_03._M_len = sVar4;
    value_3 = sVar4;
    local_88 = (Enum)ParseI32Value(this,&local_84,value_str_03);
    bVar1 = wabt::Failed((Result)local_88);
    if (bVar1) {
      wabt::Result::Result((Result *)&lane_type_local,Error);
      return (Result)lane_type_local.enum_;
    }
    v128::set_u32((v128 *)auStack_50,lane,local_84);
  }
  wabt::interp::Value::Set<v128>((Value *)(v.v._8_8_ + 8),_auStack_50);
  wabt::Result::Result((Result *)&lane_type_local,Ok);
  return (Result)lane_type_local.enum_;
}

Assistant:

wabt::Result JSONParser::ParseLaneConstValue(Type lane_type,
                                             int lane,
                                             ExpectedValue* out_value,
                                             std::string_view value_str,
                                             AllowExpected allow_expected) {
  v128 v = out_value->value.value.Get<v128>();

  switch (lane_type) {
    case Type::I8: {
      uint32_t value;
      CHECK_RESULT(ParseI32Value(&value, value_str));
      v.set_u8(lane, value);
      break;
    }

    case Type::I16: {
      uint32_t value;
      CHECK_RESULT(ParseI32Value(&value, value_str));
      v.set_u16(lane, value);
      break;
    }

    case Type::I32: {
      uint32_t value;
      CHECK_RESULT(ParseI32Value(&value, value_str));
      v.set_u32(lane, value);
      break;
    }

    case Type::I64: {
      uint64_t value;
      CHECK_RESULT(ParseI64Value(&value, value_str));
      v.set_u64(lane, value);
      break;
    }

    case Type::F32: {
      ExpectedNan nan;
      uint32_t value_bits;
      CHECK_RESULT(ParseF32Value(&value_bits, &nan, value_str, allow_expected));
      v.set_f32_bits(lane, value_bits);
      assert(lane < 4);
      out_value->nan[lane] = nan;
      break;
    }

    case Type::F64: {
      ExpectedNan nan;
      uint64_t value_bits;
      CHECK_RESULT(ParseF64Value(&value_bits, &nan, value_str, allow_expected));
      v.set_f64_bits(lane, value_bits);
      assert(lane < 2);
      out_value->nan[lane] = nan;
      break;
    }

    default:
      PrintError("unknown concrete type: \"%s\"", lane_type.GetName().c_str());
      return wabt::Result::Error;
  }

  out_value->value.value.Set<v128>(v);
  return wabt::Result::Ok;
}